

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O1

void __thiscall
CTilesetMapper::Proceed(CTilesetMapper *this,CLayerTiles *pLayer,int ConfigID,RECTi Area)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  CRuleSet *pCVar4;
  CTile *pCVar5;
  CRule *pCVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uchar uVar10;
  ulong uVar11;
  int *piVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  long in_FS_OFFSET;
  RECTi local_48;
  long local_38;
  
  local_48._8_8_ = Area._8_8_;
  local_48._0_8_ = Area._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((-1 < ConfigID) && ((pLayer->super_CLayer).m_Readonly == false)) &&
     (ConfigID < (this->m_aRuleSets).num_elements)) {
    pCVar4 = (this->m_aRuleSets).list;
    if (pCVar4[(uint)ConfigID].m_aRules.num_elements != 0) {
      CLayerTiles::Clamp(pLayer,&local_48);
      if (0 < local_48.h) {
        iVar1 = pLayer->m_Height;
        iVar2 = pLayer->m_Width;
        iVar7 = pCVar4[(uint)ConfigID].m_BaseTile;
        iVar25 = local_48.y;
        do {
          if (0 < local_48.w) {
            iVar24 = local_48.x;
            do {
              pCVar5 = pLayer->m_pTiles;
              iVar8 = pLayer->m_Width * iVar25 + iVar24;
              if ((pCVar5[iVar8].m_Index != '\0') &&
                 (pCVar5[iVar8].m_Index = (uchar)iVar7,
                 0 < pCVar4[(uint)ConfigID].m_aRules.num_elements)) {
                lVar15 = 0;
                do {
                  pCVar6 = pCVar4[(uint)ConfigID].m_aRules.list;
                  uVar11 = (ulong)pCVar6[lVar15].m_aConditions.num_elements;
                  if ((long)uVar11 < 1) {
LAB_001906ed:
                    if ((pCVar6[lVar15].m_Random < 2) ||
                       (iVar9 = rand(),
                       (int)((float)pCVar4[(uint)ConfigID].m_aRules.list[lVar15].m_Random *
                            (float)iVar9 * 4.656613e-10) == 1)) {
                      pCVar6 = pCVar4[(uint)ConfigID].m_aRules.list;
                      pCVar5[iVar8].m_Index = (uchar)pCVar6[lVar15].m_Index;
                      pCVar5[iVar8].m_Flags = '\0';
                      iVar9 = pCVar6[lVar15].m_Rotation;
                      if (iVar9 == 0x5a) {
                        uVar10 = '\b';
LAB_00190774:
                        pCVar5[iVar8].m_Flags = uVar10;
                      }
                      else {
                        if (iVar9 == 0x10e) {
                          uVar10 = '\v';
                          goto LAB_00190774;
                        }
                        if (iVar9 == 0xb4) {
                          uVar10 = '\x03';
                          goto LAB_00190774;
                        }
                      }
                      if (pCVar6[lVar15].m_HFlip != 0) {
                        pCVar5[iVar8].m_Flags =
                             2U - ((pCVar5[iVar8].m_Flags & 8) == 0) ^ pCVar5[iVar8].m_Flags;
                      }
                      if (pCVar6[lVar15].m_VFlip != 0) {
                        pCVar5[iVar8].m_Flags =
                             ((pCVar5[iVar8].m_Flags & 8) == 0) + 1U ^ pCVar5[iVar8].m_Flags;
                      }
                    }
                  }
                  else {
                    iVar14 = pLayer->m_Height + -1;
                    iVar9 = pLayer->m_Width + -1;
                    piVar12 = &(pCVar6[lVar15].m_aConditions.list)->m_Value;
                    uVar18 = 1;
                    bVar21 = 1;
                    do {
                      iVar16 = piVar12[-1] + iVar25;
                      iVar13 = iVar14;
                      if (iVar16 < iVar14) {
                        iVar13 = iVar16;
                      }
                      if (iVar16 < 0) {
                        iVar13 = 0;
                      }
                      iVar23 = ((CRuleCondition *)(piVar12 + -2))->m_X + iVar24;
                      iVar16 = iVar9;
                      if (iVar23 < iVar9) {
                        iVar16 = iVar23;
                      }
                      if (iVar23 < 0) {
                        iVar16 = 0;
                      }
                      uVar17 = iVar16 + iVar13 * pLayer->m_Width;
                      bVar20 = 0;
                      if ((-1 < (int)uVar17) && ((int)uVar17 < iVar1 * iVar2)) {
                        uVar3 = *piVar12;
                        bVar19 = pLayer->m_pTiles[uVar17].m_Index;
                        if (uVar3 < 0xfffffffe) {
                          bVar20 = bVar21;
                          if (uVar3 != bVar19) {
                            bVar20 = 0;
                          }
                        }
                        else {
                          bVar22 = bVar21;
                          if (bVar19 != 0) {
                            bVar22 = 0;
                          }
                          if (uVar3 != 0xfffffffe) {
                            bVar22 = bVar21;
                          }
                          if (bVar19 != 0) {
                            bVar19 = bVar22;
                          }
                          bVar20 = bVar19;
                          if (uVar3 != 0xffffffff) {
                            bVar20 = bVar22;
                          }
                        }
                      }
                      if (uVar11 <= uVar18) break;
                      piVar12 = piVar12 + 3;
                      uVar18 = uVar18 + 1;
                      bVar21 = bVar20;
                    } while ((bVar20 & 1) != 0);
                    if ((bVar20 & 1) != 0) goto LAB_001906ed;
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 < pCVar4[(uint)ConfigID].m_aRules.num_elements);
              }
              iVar24 = iVar24 + 1;
            } while (iVar24 < local_48.w + local_48.x);
          }
          iVar25 = iVar25 + 1;
        } while (iVar25 < local_48.h + local_48.y);
      }
      (((this->super_IAutoMapper).m_pEditor)->m_Map).m_Modified = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTilesetMapper::Proceed(CLayerTiles *pLayer, int ConfigID, RECTi Area)
{
	if(pLayer->m_Readonly || ConfigID < 0 || ConfigID >= m_aRuleSets.size())
		return;

	CRuleSet *pConf = &m_aRuleSets[ConfigID];

	if(!pConf->m_aRules.size())
		return;

	pLayer->Clamp(&Area);
	
	int BaseTile = pConf->m_BaseTile;

	// auto map !
	int MaxIndex = pLayer->m_Width*pLayer->m_Height;
	for(int y = Area.y; y < Area.y + Area.h; y++)
		for(int x = Area.x; x < Area.x + Area.w; x++)
		{
			CTile *pTile = &(pLayer->m_pTiles[y*pLayer->m_Width+x]);
			if(pTile->m_Index == 0)
				continue;

			pTile->m_Index = BaseTile;

			for(int i = 0; i < pConf->m_aRules.size(); ++i)
			{
				bool RespectRules = true;
				for(int j = 0; j < pConf->m_aRules[i].m_aConditions.size() && RespectRules; ++j)
				{
					CRuleCondition *pCondition = &pConf->m_aRules[i].m_aConditions[j];
					int CheckIndex = clamp((y+pCondition->m_Y), 0, pLayer->m_Height-1)*pLayer->m_Width+clamp((x+pCondition->m_X), 0, pLayer->m_Width-1);

					if(CheckIndex < 0 || CheckIndex >= MaxIndex)
						RespectRules = false;
					else
					{
 						if(pCondition->m_Value == CRuleCondition::EMPTY || pCondition->m_Value == CRuleCondition::FULL)
						{
							if(pLayer->m_pTiles[CheckIndex].m_Index > 0 && pCondition->m_Value == CRuleCondition::EMPTY)
								RespectRules = false;

							if(pLayer->m_pTiles[CheckIndex].m_Index == 0 && pCondition->m_Value == CRuleCondition::FULL)
								RespectRules = false;
						}
						else
						{
							if(pLayer->m_pTiles[CheckIndex].m_Index != pCondition->m_Value)
								RespectRules = false;
						}
					}
				}

				if(RespectRules && (pConf->m_aRules[i].m_Random <= 1 || (int)(random_float() * pConf->m_aRules[i].m_Random) == 1))
				{
					pTile->m_Index = pConf->m_aRules[i].m_Index;
					pTile->m_Flags = 0;

					// rotate
					if(pConf->m_aRules[i].m_Rotation == 90)
						pTile->m_Flags ^= TILEFLAG_ROTATE;
					else if(pConf->m_aRules[i].m_Rotation == 180)
						pTile->m_Flags ^= (TILEFLAG_HFLIP|TILEFLAG_VFLIP);
					else if(pConf->m_aRules[i].m_Rotation == 270)
						pTile->m_Flags ^= (TILEFLAG_HFLIP|TILEFLAG_VFLIP|TILEFLAG_ROTATE);

					// flip
					if(pConf->m_aRules[i].m_HFlip)
						pTile->m_Flags ^= pTile->m_Flags&TILEFLAG_ROTATE ? TILEFLAG_HFLIP : TILEFLAG_VFLIP;
					if(pConf->m_aRules[i].m_VFlip)
						pTile->m_Flags ^= pTile->m_Flags&TILEFLAG_ROTATE ? TILEFLAG_VFLIP : TILEFLAG_HFLIP;
				}
			}
		}

	m_pEditor->m_Map.m_Modified = true;
}